

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O0

time_t curl_getdate(char *p,time_t *now)

{
  int iVar1;
  char *pcStack_28;
  int rc;
  time_t parsed;
  time_t *now_local;
  char *p_local;
  
  pcStack_28 = (char *)0xffffffffffffffff;
  parsed = (time_t)now;
  now_local = (time_t *)p;
  iVar1 = parsedate(p,(time_t *)&stack0xffffffffffffffd8);
  if (iVar1 == 0) {
    if (pcStack_28 == (char *)0xffffffffffffffff) {
      pcStack_28 = (char *)0x0;
    }
    p_local = pcStack_28;
  }
  else {
    p_local = (char *)0xffffffffffffffff;
  }
  return (time_t)p_local;
}

Assistant:

time_t curl_getdate(const char *p, const time_t *now)
{
  time_t parsed = -1;
  int rc = parsedate(p, &parsed);
  (void)now; /* legacy argument from the past that we ignore */

  if(rc == PARSEDATE_OK) {
    if(parsed == -1)
      /* avoid returning -1 for a working scenario */
      parsed++;
    return parsed;
  }
  /* everything else is fail */
  return -1;
}